

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcache.h
# Opt level: O1

QPixmapCacheEntry * __thiscall
QCache<QPixmapCache::Key,_QPixmapCacheEntry>::relink
          (QCache<QPixmapCache::Key,_QPixmapCacheEntry> *this,Key *key)

{
  byte bVar1;
  Chain *pCVar2;
  QPixmapCacheEntry *pQVar3;
  Chain *pCVar4;
  Bucket BVar5;
  
  if ((this->d).size != 0) {
    BVar5 = QHashPrivate::Data<QCache<QPixmapCache::Key,_QPixmapCacheEntry>::Node>::
            findBucket<QPixmapCache::Key>(&this->d,key);
    bVar1 = (BVar5.span)->offsets[BVar5.index];
    if (bVar1 == 0xff) {
      pCVar4 = (Chain *)0x0;
    }
    else {
      pCVar4 = (Chain *)(((BVar5.span)->entries->storage).data + (uint)bVar1 * 0x28);
    }
    if (pCVar4 == (Chain *)0x0) {
      pQVar3 = (QPixmapCacheEntry *)0x0;
    }
    else {
      if ((this->chain).next != pCVar4) {
        pCVar2 = pCVar4->prev;
        pCVar2->next = pCVar4->next;
        pCVar4->next->prev = pCVar2;
        pCVar4->next = (this->chain).next;
        ((this->chain).next)->prev = pCVar4;
        pCVar4->prev = &this->chain;
        (this->chain).next = pCVar4;
      }
      pQVar3 = (QPixmapCacheEntry *)pCVar4[1].next;
    }
    return pQVar3;
  }
  return (QPixmapCacheEntry *)0x0;
}

Assistant:

inline bool isEmpty() const noexcept { return !d.size; }